

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMiter.c
# Opt level: O3

Abc_Ntk_t * Abc_NtkMiterAnd(Abc_Ntk_t *pNtk1,Abc_Ntk_t *pNtk2,int fOr,int fCompl2)

{
  long *plVar1;
  long *plVar2;
  int iVar3;
  Abc_Ntk_t *pNtkMiter;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *p0;
  char Buffer [1000];
  char local_418 [1008];
  
  if (pNtk1->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                  ,0x187,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  if (pNtk2->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                  ,0x188,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  if (pNtk1->vCos->nSize != 1) {
    __assert_fail("1 == Abc_NtkCoNum(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                  ,0x189,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  if (pNtk2->vCos->nSize != 1) {
    __assert_fail("1 == Abc_NtkCoNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                  ,0x18a,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  if (pNtk1->nObjCounts[8] != 0) {
    __assert_fail("0 == Abc_NtkLatchNum(pNtk1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                  ,0x18b,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  if (pNtk2->nObjCounts[8] != 0) {
    __assert_fail("0 == Abc_NtkLatchNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                  ,0x18c,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  if (pNtk1->vCis->nSize != pNtk2->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                  ,0x18d,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
  }
  if (pNtk1->vBoxes->nSize == 0) {
    if (pNtk2->vBoxes->nSize != 0) {
      __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk2)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                    ,399,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
    }
    pNtkMiter = Abc_NtkAlloc(ABC_NTK_STRASH,ABC_FUNC_AIG,1);
    builtin_strncpy(local_418,"product",8);
    pcVar4 = Extra_UtilStrsav(local_418);
    pNtkMiter->pName = pcVar4;
    Abc_NtkMiterPrepare(pNtk1,pNtk2,pNtkMiter,1,-1,0);
    Abc_NtkMiterAddOne(pNtk1,pNtkMiter);
    Abc_NtkMiterAddOne(pNtk2,pNtkMiter);
    if ((0 < pNtk1->vPos->nSize) && (0 < pNtk2->vPos->nSize)) {
      plVar1 = (long *)*pNtk1->vPos->pArray;
      plVar2 = (long *)*pNtk2->vPos->pArray;
      p0 = (Abc_Obj_t *)
           ((ulong)(*(uint *)((long)plVar1 + 0x14) >> 10 & 1) ^
           *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                               (long)*(int *)plVar1[4] * 8) + 0x40));
      pAVar5 = (Abc_Obj_t *)
               ((ulong)((*(uint *)((long)plVar2 + 0x14) >> 10 & 1) != fCompl2) ^
               *(ulong *)(*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                   (long)*(int *)plVar2[4] * 8) + 0x40));
      if (fOr == 0) {
        pAVar5 = Abc_AigAnd((Abc_Aig_t *)pNtkMiter->pManFunc,p0,pAVar5);
      }
      else {
        pAVar5 = Abc_AigOr((Abc_Aig_t *)pNtkMiter->pManFunc,p0,pAVar5);
      }
      if (0 < pNtkMiter->vPos->nSize) {
        Abc_ObjAddFanin((Abc_Obj_t *)*pNtkMiter->vPos->pArray,pAVar5);
        iVar3 = Abc_NtkCheck(pNtkMiter);
        if (iVar3 == 0) {
          puts("Abc_NtkMiterAnd: The network check has failed.");
          Abc_NtkDelete(pNtkMiter);
          pNtkMiter = (Abc_Ntk_t *)0x0;
        }
        return pNtkMiter;
      }
    }
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  __assert_fail("Abc_NtkHasOnlyLatchBoxes(pNtk1)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcMiter.c"
                ,0x18e,"Abc_Ntk_t *Abc_NtkMiterAnd(Abc_Ntk_t *, Abc_Ntk_t *, int, int)");
}

Assistant:

Abc_Ntk_t * Abc_NtkMiterAnd( Abc_Ntk_t * pNtk1, Abc_Ntk_t * pNtk2, int fOr, int fCompl2 )
{
    char Buffer[1000];
    Abc_Ntk_t * pNtkMiter;
    Abc_Obj_t * pOutput1, * pOutput2;
    Abc_Obj_t * pRoot1, * pRoot2, * pMiter;

    assert( Abc_NtkIsStrash(pNtk1) );
    assert( Abc_NtkIsStrash(pNtk2) );
    assert( 1 == Abc_NtkCoNum(pNtk1) );
    assert( 1 == Abc_NtkCoNum(pNtk2) );
    assert( 0 == Abc_NtkLatchNum(pNtk1) );
    assert( 0 == Abc_NtkLatchNum(pNtk2) );
    assert( Abc_NtkCiNum(pNtk1) == Abc_NtkCiNum(pNtk2) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk1) );
    assert( Abc_NtkHasOnlyLatchBoxes(pNtk2) );

    // start the new network
    pNtkMiter = Abc_NtkAlloc( ABC_NTK_STRASH, ABC_FUNC_AIG, 1 );
//    sprintf( Buffer, "%s_%s_miter", pNtk1->pName, pNtk2->pName );
    sprintf( Buffer, "product" );
    pNtkMiter->pName = Extra_UtilStrsav(Buffer);

    // perform strashing
    Abc_NtkMiterPrepare( pNtk1, pNtk2, pNtkMiter, 1, -1, 0 );
    Abc_NtkMiterAddOne( pNtk1, pNtkMiter );
    Abc_NtkMiterAddOne( pNtk2, pNtkMiter );
//    Abc_NtkMiterFinalize( pNtk1, pNtk2, pNtkMiter, 1 );
    pRoot1 = Abc_NtkPo(pNtk1,0);
    pRoot2 = Abc_NtkPo(pNtk2,0);
    pOutput1 = Abc_ObjNotCond( Abc_ObjFanin0(pRoot1)->pCopy, Abc_ObjFaninC0(pRoot1) );
    pOutput2 = Abc_ObjNotCond( Abc_ObjFanin0(pRoot2)->pCopy, (int)Abc_ObjFaninC0(pRoot2) ^ fCompl2 );
    
    // create the miter of the two outputs
    if ( fOr )
        pMiter = Abc_AigOr( (Abc_Aig_t *)pNtkMiter->pManFunc, pOutput1, pOutput2 );
    else
        pMiter = Abc_AigAnd( (Abc_Aig_t *)pNtkMiter->pManFunc, pOutput1, pOutput2 );
    Abc_ObjAddFanin( Abc_NtkPo(pNtkMiter,0), pMiter );

    // make sure that everything is okay
    if ( !Abc_NtkCheck( pNtkMiter ) )
    {
        printf( "Abc_NtkMiterAnd: The network check has failed.\n" );
        Abc_NtkDelete( pNtkMiter );
        return NULL;
    }
    return pNtkMiter;
}